

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O3

void dump_bb(dill_stream c,basic_block *bb,int i)

{
  void *info_ptr;
  ulong uVar1;
  long lVar2;
  void *pvVar3;
  
  printf("\nBasic block %d, start %zd, end %zd, label %d, fall %d, branch_to %d\n",(ulong)(uint)i,
         bb->start,bb->end,(ulong)(uint)bb->label,(ulong)(uint)bb->fall_through,bb->end_branch_label
        );
  printf("    defines :");
  dump_reg_vec(bb->regs_defined);
  printf("\n    uses :");
  dump_reg_vec(bb->regs_used);
  printf("\n    live_at_end :");
  dump_reg_vec(bb->live_at_end);
  printf("\n    succ :");
  if (bb->succ_count != 0) {
    uVar1 = 0;
    do {
      printf(" %d",(ulong)(uint)bb->succ_list[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (ulong)(long)bb->succ_count);
  }
  printf("\n    preds :");
  if (bb->pred_count != 0) {
    uVar1 = 0;
    do {
      printf(" %d",(ulong)(uint)bb->pred_list[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (ulong)(long)bb->pred_count);
  }
  if (bb->is_loop_start != 0) {
    printf(" - LOOP_START");
  }
  if (bb->is_loop_end != 0) {
    printf(" - LOOP_END");
  }
  putchar(10);
  pvVar3 = (void *)bb->start;
  if (pvVar3 <= (void *)bb->end) {
    lVar2 = (long)pvVar3 * 0x28;
    do {
      info_ptr = pvVar3;
      printf(" %zd - ");
      virtual_print_insn(c,info_ptr,(c->p->virtual).code_base + lVar2);
      putchar(10);
      pvVar3 = (void *)((long)pvVar3 + 1);
      lVar2 = lVar2 + 0x28;
    } while (pvVar3 <= (void *)bb->end);
  }
  return;
}

Assistant:

static void
dump_bb(dill_stream c, struct basic_block* bb, int i)
{
    size_t j;
    printf(
        "\nBasic block %d, start %zd, end %zd, label %d, fall %d, branch_to "
        "%d\n",
        i, bb->start, bb->end, bb->label, bb->fall_through,
        bb->end_branch_label);
    printf("    defines :");
    dump_reg_vec(bb->regs_defined);
    printf("\n    uses :");
    dump_reg_vec(bb->regs_used);
    printf("\n    live_at_end :");
    dump_reg_vec(bb->live_at_end);
    printf("\n    succ :");
    for (j = 0; j < bb->succ_count; j++) {
        printf(" %d", bb->succ_list[j]);
    }
    printf("\n    preds :");
    for (j = 0; j < bb->pred_count; j++) {
        printf(" %d", bb->pred_list[j]);
    }
    if (bb->is_loop_start)
        printf(" - LOOP_START");
    if (bb->is_loop_end)
        printf(" - LOOP_END");
    printf("\n");
    for (j = (size_t)bb->start; j <= (size_t)bb->end; j++) {
        printf(" %zd - ", j);
        virtual_print_insn(
            c, NULL,
            ((char*)c->p->virtual.code_base) + j * sizeof(virtual_insn));
        printf("\n");
    }
}